

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

Address __thiscall
ParamListStandard::assignAddress
          (ParamListStandard *this,Datatype *tp,vector<int,_std::allocator<int>_> *status)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  long *in_RCX;
  vector<int,_std::allocator<int>_> *extraout_RDX;
  Address AVar5;
  vector<int,_std::allocator<int>_> *pvVar4;
  
  puVar2 = (undefined8 *)(tp->name).field_2._M_allocated_capacity;
  pvVar4 = status;
  do {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 == &(tp->name).field_2) {
      (this->super_ParamList)._vptr_ParamList = (_func_int **)0x0;
LAB_00255bc8:
      AVar5.offset = (uintb)pvVar4;
      AVar5.base = (AddrSpace *)this;
      return AVar5;
    }
    uVar1 = *(uint *)(puVar2 + 3);
    if ((-1 < *(int *)(*in_RCX + (long)(int)uVar1 * 4)) &&
       ((*(int *)((long)puVar2 + 0x14) == 8 ||
        (*(int *)&status[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == *(int *)((long)puVar2 + 0x14))))) {
      AVar5 = ParamEntry::getAddrBySlot
                        ((ParamEntry *)this,(int4 *)(puVar2 + 2),(int)*in_RCX + uVar1 * 4);
      pvVar4 = (vector<int,_std::allocator<int>_> *)AVar5.offset;
      if ((this->super_ParamList)._vptr_ParamList != (_func_int **)0x0) {
        if ((*(int *)(puVar2 + 7) == 0) && (0 < *(int *)((long)puVar2 + 0x1c))) {
          iVar3 = *(int *)((long)puVar2 + 0x1c) + uVar1;
          if (iVar3 <= (int)(uVar1 + 1)) {
            iVar3 = uVar1 + 1;
          }
          memset((void *)((long)(int)uVar1 * 4 + *in_RCX),0xff,(ulong)(~uVar1 + iVar3) * 4 + 4);
          pvVar4 = extraout_RDX;
        }
        goto LAB_00255bc8;
      }
    }
    puVar2 = (undefined8 *)*puVar2;
  } while( true );
}

Assistant:

Address ParamListStandard::assignAddress(const Datatype *tp,vector<int4> &status) const

{
  list<ParamEntry>::const_iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter) {
    const ParamEntry &curEntry( *iter );
    int4 grp = curEntry.getGroup();
    if (status[grp]<0) continue;
    if ((curEntry.getType() != TYPE_UNKNOWN)&&
	tp->getMetatype() != curEntry.getType())
      continue;			// Wrong type

    Address res = curEntry.getAddrBySlot(status[grp],tp->getSize());
    if (res.isInvalid()) continue; // If -tp- doesn't fit an invalid address is returned
    if (curEntry.isExclusion()) {
      int4 maxgrp = grp + curEntry.getGroupSize();
      for(int4 j=grp;j<maxgrp;++j) // For an exclusion entry
	status[j] = -1;		// some number of groups are taken up
    }
    return res;
  }
  return Address();		// Return invalid address to indicated we could not assign anything
}